

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::StringPtr&,kj::StringPtr_const&>
          (String *__return_storage_ptr__,kj *this,StringPtr *params,StringPtr *params_1)

{
  ArrayPtr<const_char> local_28;
  undefined8 local_18;
  long local_10;
  
  local_18 = *(undefined8 *)this;
  local_10 = *(long *)(this + 8) + -1;
  local_28.ptr = (params->content).ptr;
  local_28.size_ = (params->content).size_ - 1;
  _::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_18,&local_28,(ArrayPtr<const_char> *)local_28.size_)
  ;
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}